

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serv.cpp
# Opt level: O2

UVector * __thiscall
icu_63::ICUService::getDisplayNames
          (ICUService *this,UVector *result,Locale *locale,UnicodeString *matchID,UErrorCode *status
          )

{
  UnicodeString *pUVar1;
  bool bVar2;
  UBool UVar3;
  char cVar4;
  int iVar5;
  DNCache *pDVar6;
  undefined4 extraout_var;
  UHashElement *pUVar8;
  StringPair *obj;
  Locale *p;
  UErrorCode *size;
  UnicodeString *p_00;
  int32_t pos_1;
  Mutex mutex;
  int32_t pos;
  int32_t local_94;
  Locale *local_90;
  Mutex local_88;
  UObject local_80;
  Hashtable *local_78;
  UnicodeString local_70;
  long *plVar7;
  
  UVector::removeAllElements(result);
  UVector::setDeleter(result,userv_deleteStringPair);
  if (U_ZERO_ERROR < *status) goto LAB_002a1761;
  local_88.fMutex = (UMutex *)icu_63::lock;
  umtx_lock_63((UMutex *)icu_63::lock);
  if (this->dnCache == (DNCache *)0x0) {
LAB_002a1639:
    size = status;
    local_78 = getVisibleIDMap(this,status);
    if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
      local_90 = locale;
      pDVar6 = (DNCache *)UMemory::operator_new((UMemory *)0x140,(size_t)size);
      if (pDVar6 == (DNCache *)0x0) {
        this->dnCache = (DNCache *)0x0;
        *status = U_MEMORY_ALLOCATION_ERROR;
      }
      else {
        DNCache::DNCache(pDVar6,local_90);
        this->dnCache = pDVar6;
        local_94 = -1;
        local_80._vptr_UObject = (_func_int **)&PTR__UnicodeString_003edbf0;
        do {
          pUVar8 = Hashtable::nextElement(local_78,&local_94);
          if (pUVar8 == (UHashElement *)0x0) goto LAB_002a174d;
          pUVar1 = (UnicodeString *)(pUVar8->key).pointer;
          local_70.super_Replaceable.super_UObject._vptr_UObject =
               (UObject)(UObject)local_80._vptr_UObject;
          local_70.fUnion.fStackFields.fLengthAndFlags = 2;
          p_00 = pUVar1;
          (**(code **)(*(pUVar8->value).pointer + 0x28))
                    ((pUVar8->value).pointer,pUVar1,local_90,&local_70);
          if ((local_70.fUnion.fStackFields.fLengthAndFlags & 1U) == 0) {
            p_00 = &local_70;
            Hashtable::put(&this->dnCache->cache,&local_70,pUVar1,status);
            if (U_ZERO_ERROR < *status) goto LAB_002a170f;
            bVar2 = true;
          }
          else {
            *status = U_MEMORY_ALLOCATION_ERROR;
LAB_002a170f:
            pDVar6 = this->dnCache;
            if (pDVar6 != (DNCache *)0x0) {
              DNCache::~DNCache(pDVar6);
            }
            UMemory::operator_delete((UMemory *)pDVar6,p_00);
            this->dnCache = (DNCache *)0x0;
            bVar2 = false;
          }
          UnicodeString::~UnicodeString(&local_70);
        } while (bVar2);
      }
    }
    bVar2 = false;
  }
  else {
    p = locale;
    UVar3 = Locale::operator!=(&this->dnCache->locale,locale);
    pDVar6 = this->dnCache;
    if (UVar3 != '\0') {
      if (pDVar6 != (DNCache *)0x0) {
        DNCache::~DNCache(pDVar6);
      }
      UMemory::operator_delete((UMemory *)pDVar6,p);
      this->dnCache = (DNCache *)0x0;
      goto LAB_002a1639;
    }
    if (pDVar6 == (DNCache *)0x0) goto LAB_002a1639;
LAB_002a174d:
    bVar2 = true;
  }
  Mutex::~Mutex(&local_88);
  if (!bVar2) {
    return result;
  }
LAB_002a1761:
  iVar5 = (*(this->super_ICUNotifier)._vptr_ICUNotifier[0xd])(this,matchID,status);
  plVar7 = (long *)CONCAT44(extraout_var,iVar5);
  local_70.super_Replaceable.super_UObject._vptr_UObject._0_4_ = 0xffffffff;
  do {
    do {
      pUVar8 = Hashtable::nextElement(&this->dnCache->cache,(int32_t *)&local_70);
      if (pUVar8 == (UHashElement *)0x0) goto LAB_002a17de;
      pUVar1 = (UnicodeString *)(pUVar8->value).pointer;
    } while ((plVar7 != (long *)0x0) &&
            (cVar4 = (**(code **)(*plVar7 + 0x40))(plVar7,pUVar1), cVar4 == '\0'));
    obj = StringPair::create(pUVar1,(UnicodeString *)(pUVar8->key).pointer,status);
    UVector::addElement(result,obj,status);
  } while (*status < U_ILLEGAL_ARGUMENT_ERROR);
  UVector::removeAllElements(result);
LAB_002a17de:
  if (plVar7 != (long *)0x0) {
    (**(code **)(*plVar7 + 8))(plVar7);
  }
  return result;
}

Assistant:

UVector& 
ICUService::getDisplayNames(UVector& result, 
                            const Locale& locale, 
                            const UnicodeString* matchID, 
                            UErrorCode& status) const 
{
    result.removeAllElements();
    result.setDeleter(userv_deleteStringPair);
    if (U_SUCCESS(status)) {
        ICUService* ncthis = (ICUService*)this; // cast away semantic const
        Mutex mutex(&lock);

        if (dnCache != NULL && dnCache->locale != locale) {
            delete dnCache;
            ncthis->dnCache = NULL;
        }

        if (dnCache == NULL) {
            const Hashtable* m = getVisibleIDMap(status);
            if (U_FAILURE(status)) {
                return result;
            }
            ncthis->dnCache = new DNCache(locale); 
            if (dnCache == NULL) {
                status = U_MEMORY_ALLOCATION_ERROR;
                return result;
            }

            int32_t pos = UHASH_FIRST;
            const UHashElement* entry = NULL;
            while ((entry = m->nextElement(pos)) != NULL) {
                const UnicodeString* id = (const UnicodeString*)entry->key.pointer;
                ICUServiceFactory* f = (ICUServiceFactory*)entry->value.pointer;
                UnicodeString dname;
                f->getDisplayName(*id, locale, dname);
                if (dname.isBogus()) {
                    status = U_MEMORY_ALLOCATION_ERROR;
                } else {
                    dnCache->cache.put(dname, (void*)id, status); // share pointer with visibleIDMap
                    if (U_SUCCESS(status)) {
                        continue;
                    }
                }
                delete dnCache;
                ncthis->dnCache = NULL;
                return result;
            }
        }
    }

    ICUServiceKey* matchKey = createKey(matchID, status);
    /* To ensure that all elements in the hashtable are iterated, set pos to -1.
     * nextElement(pos) will skip the position at pos and begin the iteration
     * at the next position, which in this case will be 0.
     */
    int32_t pos = UHASH_FIRST; 
    const UHashElement *entry = NULL;
    while ((entry = dnCache->cache.nextElement(pos)) != NULL) {
        const UnicodeString* id = (const UnicodeString*)entry->value.pointer;
        if (matchKey != NULL && !matchKey->isFallbackOf(*id)) {
            continue;
        }
        const UnicodeString* dn = (const UnicodeString*)entry->key.pointer;
        StringPair* sp = StringPair::create(*id, *dn, status);
        result.addElement(sp, status);
        if (U_FAILURE(status)) {
            result.removeAllElements();
            break;
        }
    }
    delete matchKey;

    return result;
}